

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * google::protobuf::io::(anonymous_namespace)::DecodeVarint64KnownSize<7ul>
                    (uint8_t *buffer,uint64_t *value)

{
  size_t offset;
  long lVar1;
  uint64_t uVar2;
  byte *pbVar3;
  
  uVar2 = (ulong)buffer[6] << 0x2a;
  pbVar3 = buffer;
  for (lVar1 = 0; lVar1 != 0x2a; lVar1 = lVar1 + 7) {
    uVar2 = uVar2 + ((ulong)*pbVar3 - 0x80 << ((byte)lVar1 & 0x3f));
    pbVar3 = pbVar3 + 1;
  }
  *value = uVar2;
  return buffer + 7;
}

Assistant:

const uint8_t* DecodeVarint64KnownSize(const uint8_t* buffer, uint64_t* value) {
  GOOGLE_DCHECK_GT(N, 0);
  uint64_t result = static_cast<uint64_t>(buffer[N - 1]) << (7 * (N - 1));
  for (size_t i = 0, offset = 0; i < N - 1; i++, offset += 7) {
    result += static_cast<uint64_t>(buffer[i] - 0x80) << offset;
  }
  *value = result;
  return buffer + N;
}